

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O2

void __thiscall QNetworkRequest::setAttribute(QNetworkRequest *this,Attribute code,QVariant *value)

{
  ulong uVar1;
  QNetworkRequestPrivate *pQVar2;
  AttributesMap *this_00;
  long in_FS_OFFSET;
  Attribute local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(ulong *)&(value->d).field_0x18;
  local_1c = code;
  pQVar2 = QSharedDataPointer<QNetworkRequestPrivate>::operator->(&this->d);
  this_00 = &(pQVar2->super_QNetworkHeadersPrivate).attributes;
  if (uVar1 < 4) {
    QHash<QNetworkRequest::Attribute,_QVariant>::removeImpl<QNetworkRequest::Attribute>
              (this_00,&local_1c);
  }
  else {
    QHash<QNetworkRequest::Attribute,QVariant>::emplace<QVariant_const&>
              ((QHash<QNetworkRequest::Attribute,QVariant> *)this_00,&local_1c,value);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkRequest::setAttribute(Attribute code, const QVariant &value)
{
    if (value.isValid())
        d->attributes.insert(code, value);
    else
        d->attributes.remove(code);
}